

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O2

uint64_t internal_rle_compress(void *out,uint64_t outbytes,void *src,uint64_t srcbytes)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar3 = (byte *)(srcbytes + (long)src);
  uVar1 = 0;
  pbVar6 = (byte *)src;
  do {
    if (pbVar3 <= src) {
      return uVar1;
    }
    lVar5 = 0;
    while( true ) {
      bVar4 = (byte)lVar5;
      if (((pbVar3 <= pbVar6 + lVar5 + 1) || (*src != pbVar6[lVar5 + 1])) || (bVar4 == 0x7f)) break;
      lVar5 = lVar5 + 1;
    }
    if (bVar4 < 2) {
      while( true ) {
        pbVar7 = pbVar6 + lVar5 + 1;
        if ((pbVar3 <= pbVar7) ||
           ((((pbVar6 + lVar5 + 2 < pbVar3 && (*pbVar7 == pbVar6[lVar5 + 2])) &&
             ((pbVar6 + lVar5 + 3 < pbVar3 && (*pbVar7 == pbVar6[lVar5 + 3])))) ||
            ((byte)lVar5 == 0x7e)))) break;
        lVar5 = lVar5 + 1;
      }
      bVar4 = ~(byte)lVar5;
      uVar2 = uVar1;
      while( true ) {
        uVar1 = uVar2 + 1;
        *(byte *)((long)out + uVar2) = bVar4;
        pbVar6 = pbVar7;
        if (pbVar7 <= src) break;
        bVar4 = *src;
        src = (void *)((long)src + 1);
        uVar2 = uVar1;
      }
    }
    else {
      *(byte *)((long)out + uVar1) = bVar4;
      *(byte *)((long)out + uVar1 + 1) = *src;
      uVar1 = uVar1 + 2;
      src = pbVar6 + lVar5 + 1;
      pbVar6 = pbVar6 + lVar5 + 1;
    }
  } while (uVar1 < outbytes);
  return uVar1;
}

Assistant:

uint64_t
internal_rle_compress (
    void* out, uint64_t outbytes, const void* src, uint64_t srcbytes)
{
    int8_t*       cbuf = out;
    const int8_t* runs = src;
    const int8_t* end  = runs + srcbytes;
    const int8_t* rune = runs + 1;
    uint64_t      outb = 0;

    while (runs < end)
    {
        uint8_t curcount = 0;
        while (rune < end && *runs == *rune && curcount < MAX_RUN_LENGTH)
        {
            ++rune;
            ++curcount;
        }

        if (curcount >= (MIN_RUN_LENGTH - 1))
        {
            cbuf[outb++] = (int8_t) curcount;
            cbuf[outb++] = *runs;

            runs = rune;
        }
        else
        {
            /* incompressible */
            ++curcount;
            while (rune < end &&
                   ((rune + 1 >= end || *rune != *(rune + 1)) ||
                    (rune + 2 >= end || *(rune + 1) != *(rune + 2))) &&
                   curcount < MAX_RUN_LENGTH)
            {
                ++curcount;
                ++rune;
            }
            cbuf[outb++] = (int8_t) (-((int) curcount));
            while (runs < rune)
                cbuf[outb++] = *runs++;
        }
        ++rune;
        if (outb >= outbytes) break;
    }
    return outb;
}